

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O0

void SEM_Stmt(ast *node)

{
  int iVar1;
  ast *node_00;
  ast *in_RDI;
  ast *child1;
  ast *in_stack_00000058;
  undefined4 in_stack_ffffffffffffffe8;
  
  node_00 = child(in_RDI,1);
  iVar1 = node_00->type;
  if (iVar1 == -0x2704) {
    SEM_CompSt(node_00,(field_t *)CONCAT44(0xffffd8fc,in_stack_ffffffffffffffe8));
  }
  else if (iVar1 == -0x26fd) {
    SEM_Exp(in_stack_00000058);
  }
  else if (iVar1 == 0x118) {
    sibling(node_00,1);
    SEM_RETURN(node_00);
  }
  else if (iVar1 == 0x119) {
    SEM_IF(node_00);
  }
  else {
    if (iVar1 != 0x11b) {
      abort();
    }
    SEM_WHILE((ast *)0x10c980);
  }
  return;
}

Assistant:

static void SEM_Stmt(struct ast *node) {
    struct ast *child1 = child(node, 1);
    switch (child1->type) {
        case Exp:
            SEM_Exp(child1);
            break;
        case CompSt:
            SEM_CompSt(child1, NULL);
            break;
        case RETURN:
            SEM_RETURN(sibling(child1, 1));
            break;
        case IF:
            SEM_IF(child1);
            break;
        case WHILE:
            SEM_WHILE(child1);
            break;
        default:
            abort();
    }
}